

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

Range __thiscall bssl::DTLSMessageBitmap::NextUnmarkedRange(DTLSMessageBitmap *this,size_t start)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  byte *pbVar6;
  uchar *puVar7;
  Range RVar8;
  size_t local_50;
  Range extra;
  bool should_extend;
  ulong uStack_38;
  uint8_t byte;
  size_t idx;
  size_t local_28;
  size_t start_local;
  DTLSMessageBitmap *this_local;
  Range range;
  
  idx = this->first_unmarked_byte_ << 3;
  local_28 = start;
  start_local = (size_t)this;
  puVar4 = std::max<unsigned_long>(&local_28,&idx);
  local_28 = *puVar4;
  uStack_38 = local_28 >> 3;
  sVar5 = Array<unsigned_char>::size(&this->bytes_);
  if (uStack_38 < sVar5) {
    pbVar6 = Array<unsigned_char>::operator[](&this->bytes_,uStack_38);
    bVar1 = *pbVar6;
    bVar2 = BitRange(0,local_28 & 7);
    extra.end._7_1_ = bVar1 | bVar2;
    if (extra.end._7_1_ == 0xff) {
      do {
        uStack_38 = uStack_38 + 1;
        sVar5 = Array<unsigned_char>::size(&this->bytes_);
        if (sVar5 <= uStack_38) goto LAB_0031d99d;
        puVar7 = Array<unsigned_char>::operator[](&this->bytes_,uStack_38);
      } while (*puVar7 == 0xff);
      pbVar6 = Array<unsigned_char>::operator[](&this->bytes_,uStack_38);
      extra.end._7_1_ = *pbVar6;
LAB_0031d99d:
      sVar5 = Array<unsigned_char>::size(&this->bytes_);
      if (sVar5 <= uStack_38) {
        _this_local = (Range)ZEXT816(0);
        return _this_local;
      }
    }
    _this_local = FirstUnmarkedRangeInByte(extra.end._7_1_);
    bVar3 = Range::empty((Range *)&this_local);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!range.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x93,
                    "DTLSMessageBitmap::Range bssl::DTLSMessageBitmap::NextUnmarkedRange(size_t) const"
                   );
    }
    bVar3 = range.start == 8;
    range.start = uStack_38 * 8 + range.start;
    this_local = (DTLSMessageBitmap *)(&(this_local->bytes_).data_ + uStack_38);
    if (bVar3) {
      do {
        uStack_38 = uStack_38 + 1;
        sVar5 = Array<unsigned_char>::size(&this->bytes_);
        if (sVar5 <= uStack_38) break;
        puVar7 = Array<unsigned_char>::operator[](&this->bytes_,uStack_38);
      } while (*puVar7 == '\0');
      range.start = uStack_38 * 8;
      sVar5 = Array<unsigned_char>::size(&this->bytes_);
      if (uStack_38 < sVar5) {
        puVar7 = Array<unsigned_char>::operator[](&this->bytes_,uStack_38);
        RVar8 = FirstUnmarkedRangeInByte(*puVar7);
        local_50 = RVar8.start;
        if (local_50 == 0) {
          extra.start = RVar8.end;
          range.start = extra.start + range.start;
        }
      }
    }
  }
  else {
    _this_local = (Range)ZEXT816(0);
  }
  return _this_local;
}

Assistant:

DTLSMessageBitmap::Range DTLSMessageBitmap::NextUnmarkedRange(
    size_t start) const {
  // Don't bother looking at bytes that are known to be fully marked.
  start = std::max(start, first_unmarked_byte_ << 3);

  size_t idx = start >> 3;
  if (idx >= bytes_.size()) {
    return Range{0, 0};
  }

  // Look at the bits from |start| up to a byte boundary.
  uint8_t byte = bytes_[idx] | BitRange(0, start & 7);
  if (byte == 0xff) {
    // Nothing unmarked at this byte. Keep searching for an unmarked bit.
    for (idx = idx + 1; idx < bytes_.size(); idx++) {
      if (bytes_[idx] != 0xff) {
        byte = bytes_[idx];
        break;
      }
    }
    if (idx >= bytes_.size()) {
      return Range{0, 0};
    }
  }

  Range range = FirstUnmarkedRangeInByte(byte);
  assert(!range.empty());
  bool should_extend = range.end == 8;
  range.start += idx << 3;
  range.end += idx << 3;
  if (!should_extend) {
    // The range did not end at a byte boundary. We're done.
    return range;
  }

  // Collect all fully unmarked bytes.
  for (idx = idx + 1; idx < bytes_.size(); idx++) {
    if (bytes_[idx] != 0) {
      break;
    }
  }
  range.end = idx << 3;

  // Add any bits from the remaining byte, if any.
  if (idx < bytes_.size()) {
    Range extra = FirstUnmarkedRangeInByte(bytes_[idx]);
    if (extra.start == 0) {
      range.end += extra.end;
    }
  }

  return range;
}